

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wwf.cpp
# Opt level: O1

void print(bool **arr,string *s)

{
  bool bVar1;
  ostream *poVar2;
  long lVar3;
  long lVar4;
  
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,(s->_M_dataplus)._M_p,s->_M_string_length);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  if (0 < bsize) {
    lVar4 = 1;
    do {
      if (0 < bsize) {
        lVar3 = 0;
        do {
          std::ostream::_M_insert<bool>(true);
          lVar3 = lVar3 + 1;
        } while (lVar3 < bsize);
      }
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x58);
      std::ostream::put(-0x58);
      std::ostream::flush();
      bVar1 = lVar4 < bsize;
      lVar4 = lVar4 + 1;
    } while (bVar1);
  }
  return;
}

Assistant:

void print(bool **arr, const string &s) {
    cout << s << endl;
    for (int i = 1; i <= bsize; i++) {
        for (int j = 1; j <= bsize; j++) {
            cout << arr[i][j];
        }
        cout << endl;
    }
}